

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-capability.c++
# Opt level: O1

Request<capnp::DynamicStruct,_capnp::DynamicStruct> * __thiscall
capnp::DynamicCapability::Client::newRequest
          (Request<capnp::DynamicStruct,_capnp::DynamicStruct> *__return_storage_ptr__,Client *this,
          Method method,Maybe<capnp::MessageSize> *sizeHint)

{
  byte bVar1;
  ClientHook *pCVar2;
  PointerBuilder builder;
  undefined8 uVar3;
  InterfaceSchema methodInterface;
  Fault f;
  DebugExpression<bool> local_e8;
  undefined7 uStack_e7;
  undefined8 uStack_e0;
  WirePointer *local_d8;
  Disposer *local_d0;
  RequestHook *local_c8;
  Schema local_c0;
  Schema local_b8;
  Schema local_b0;
  char local_a8 [8];
  undefined4 local_a0;
  undefined4 uStack_9c;
  uint uStack_98;
  undefined4 uStack_94;
  Builder local_90;
  Reader local_60;
  
  local_b0 = method.parent.super_Schema.raw;
  local_e8.value = InterfaceSchema::extends(&this->schema,method.parent);
  if (local_e8.value) {
    local_b8.raw = (RawBrandedSchema *)InterfaceSchema::Method::getParamType(&method);
    local_c0.raw = (RawBrandedSchema *)InterfaceSchema::Method::getResultType(&method);
    bVar1 = *(byte *)(*(long *)local_c0.raw + 0x70);
    pCVar2 = (this->super_Client).hook.ptr;
    Schema::getProto(&local_60,&local_b0);
    if (local_60._reader.dataSize < 0x40) {
      uVar3 = 0;
    }
    else {
      uVar3 = *local_60._reader.data;
    }
    local_a8[0] = (sizeHint->ptr).isSet;
    if ((bool)local_a8[0] == true) {
      local_a0 = *(undefined4 *)&(sizeHint->ptr).field_1;
      uStack_9c = *(undefined4 *)((long)&(sizeHint->ptr).field_1 + 4);
      uStack_98 = (sizeHint->ptr).field_1.value.capCount;
      uStack_94 = *(undefined4 *)((long)&(sizeHint->ptr).field_1 + 0xc);
    }
    (**pCVar2->_vptr_ClientHook)
              (&local_e8,pCVar2,uVar3,(ulong)method.ordinal,local_a8,(ulong)(bVar1 ^ 1));
    builder.segment._1_7_ = uStack_e7;
    builder.segment._0_1_ = local_e8.value;
    builder.capTable = (CapTableBuilder *)uStack_e0;
    builder.pointer = local_d8;
    capnp::_::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
              (&local_90,builder,(StructSchema)local_b8.raw);
    (__return_storage_ptr__->super_Builder).builder.pointers = local_90.builder.pointers;
    (__return_storage_ptr__->super_Builder).builder.dataSize = local_90.builder.dataSize;
    (__return_storage_ptr__->super_Builder).builder.pointerCount = local_90.builder.pointerCount;
    *(undefined2 *)&(__return_storage_ptr__->super_Builder).builder.field_0x26 =
         local_90.builder._38_2_;
    (__return_storage_ptr__->super_Builder).builder.capTable = local_90.builder.capTable;
    (__return_storage_ptr__->super_Builder).builder.data = local_90.builder.data;
    (__return_storage_ptr__->super_Builder).schema.super_Schema.raw =
         (RawBrandedSchema *)local_90.schema.super_Schema.raw;
    (__return_storage_ptr__->super_Builder).builder.segment = local_90.builder.segment;
    (__return_storage_ptr__->hook).disposer = local_d0;
    (__return_storage_ptr__->hook).ptr = local_c8;
    (__return_storage_ptr__->resultSchema).super_Schema.raw = local_c0.raw;
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[42]>
            ((Fault *)&local_60,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-capability.c++"
             ,0x26,FAILED,"schema.extends(methodInterface)",
             "_kjCondition,\"Interface does not implement this method.\"",&local_e8,
             (char (*) [42])"Interface does not implement this method.");
  kj::_::Debug::Fault::fatal((Fault *)&local_60);
}

Assistant:

Request<DynamicStruct, DynamicStruct> DynamicCapability::Client::newRequest(
    InterfaceSchema::Method method, kj::Maybe<MessageSize> sizeHint) {
  auto methodInterface = method.getContainingInterface();

  KJ_REQUIRE(schema.extends(methodInterface), "Interface does not implement this method.");

  auto paramType = method.getParamType();
  auto resultType = method.getResultType();

  CallHints hints;
  hints.noPromisePipelining = !resultType.mayContainCapabilities();

  auto typeless = hook->newCall(
      methodInterface.getProto().getId(), method.getIndex(), sizeHint, hints);

  return Request<DynamicStruct, DynamicStruct>(
      typeless.getAs<DynamicStruct>(paramType), kj::mv(typeless.hook), resultType);
}